

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Int_t * Gia_SimCollectBest(Vec_Flt_t *vQuo)

{
  float fVar1;
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  
  uVar2 = vQuo->nSize;
  uVar5 = (ulong)uVar2;
  if (uVar5 != 0) {
    fVar7 = *vQuo->pArray;
    if (1 < (int)uVar2) {
      uVar4 = 1;
      do {
        fVar1 = vQuo->pArray[uVar4];
        if (fVar1 <= fVar7) {
          fVar1 = fVar7;
        }
        fVar7 = fVar1;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    if (0.0 < fVar7) {
      p = (Vec_Int_t *)malloc(0x10);
      p->nCap = 100;
      p->nSize = 0;
      piVar3 = (int *)malloc(400);
      p->pArray = piVar3;
      if ((int)uVar2 < 1) {
        return p;
      }
      lVar6 = 0;
      do {
        if ((vQuo->pArray[lVar6] == fVar7) && (!NAN(vQuo->pArray[lVar6]) && !NAN(fVar7))) {
          Vec_IntPush(p,(int)lVar6);
          uVar5 = (ulong)(uint)vQuo->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (int)uVar5);
      return p;
    }
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Gia_SimCollectBest( Vec_Flt_t * vQuo )
{
    Vec_Int_t * vRes; int i;
    float Value, ValueMax = Vec_FltFindMax( vQuo );
    if ( ValueMax <= 0 )
        return NULL;
    vRes = Vec_IntAlloc( 100 );  // variables with max quo
    Vec_FltForEachEntry( vQuo, Value, i )
        if ( Value == ValueMax )
            Vec_IntPush( vRes, i );
    return vRes;
}